

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void com_alf_lcu_row(com_core_t *core,int lcu_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  com_pic_t *pcVar6;
  com_seqh_t *pcVar7;
  com_pic_header_t *pcVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  u8 (*pauVar16) [3];
  int (*paiVar17) [9];
  int local_118;
  int local_114;
  int local_110;
  int i_3;
  int cpy_size_1;
  pel *tmp_s_1;
  pel *tmp_d_1;
  int i_2;
  int cpy_size;
  pel *tmp_s;
  pel *tmp_d;
  int *coef;
  u8 *enable_flag;
  int lcu_w_c;
  int lcu_w;
  int i_1;
  int i;
  pel *tmpr;
  pel *tmpl;
  s8 *map_patch;
  int adj_c;
  int adj_l;
  pel *bufc;
  pel *bufl;
  int i_bufc;
  int i_bufl;
  int pix_y_c;
  int height_offset;
  int y_offset;
  int isBelowAvail;
  int isAboveAvail;
  int lcu_h_c;
  int lcu_h;
  int lcu_idx;
  pel *dstc;
  pel *dstl;
  int i_dstc;
  int i_dstl;
  int img_height;
  int img_width;
  int bit_depth;
  int pix_y;
  int pix_x;
  int lcu_size;
  com_alf_pic_param_t *alfParam;
  com_map_t *map;
  com_seqh_t *seqhdr;
  com_pic_t *pic;
  int lcu_y_local;
  com_core_t *core_local;
  
  pcVar6 = core->pic;
  pcVar7 = core->seqhdr;
  pcVar8 = core->pichdr;
  iVar1 = pcVar7->max_cuwh;
  iVar10 = lcu_y * iVar1;
  iVar2 = pcVar7->bit_depth_internal;
  iVar3 = pcVar7->pic_width;
  iVar4 = pcVar6->stride_luma;
  iVar5 = pcVar6->stride_chroma;
  lcu_h_c = lcu_y * pcVar7->pic_width_in_lcu;
  local_114 = iVar1;
  if (pcVar7->pic_height - iVar10 <= iVar1) {
    local_114 = pcVar7->pic_height - iVar10;
  }
  bVar9 = 0 < lcu_y;
  pix_y_c = 0;
  i_bufl = 0;
  iVar11 = iVar1 + 0x20;
  iVar12 = (iVar1 / 2 + 0x20) * 2;
  bufc = core->alf_src_buf[0] + 0x20;
  _adj_c = core->alf_src_buf[1] + 0x20;
  map_patch._4_4_ = 3;
  map_patch._0_4_ = 6;
  if ((((pcVar7->cross_patch_loop_filter == '\0') && (bVar9)) &&
      (pcVar15 = (core->map).map_patch + lcu_y * pcVar7->pic_width_in_lcu, bVar9)) &&
     (*pcVar15 != pcVar15[-pcVar7->pic_width_in_lcu])) {
    bVar9 = false;
  }
  if (bVar9) {
    pix_y_c = -4;
    i_bufl = 4;
  }
  if (lcu_y < pcVar7->pic_height_in_lcu + -1) {
    i_bufl = i_bufl + -4;
  }
  dstc = pcVar6->y + (iVar10 + pix_y_c) * iVar4;
  _lcu_h = pcVar6->uv + ((iVar10 >> 1) + pix_y_c) * iVar5;
  iVar10 = i_bufl + local_114;
  iVar13 = i_bufl + (local_114 >> 1);
  _i_1 = (ushort *)(dstc + (long)iVar3 + -1);
  tmpr = dstc;
  for (lcu_w = 0; lcu_w < iVar10; lcu_w = lcu_w + 1) {
    *(uint *)(tmpr + -4) = (uint)*tmpr * 0x1010101;
    *(uint *)((long)_i_1 + 1) = (uint)*(byte *)_i_1 * 0x1010101;
    tmpr = tmpr + iVar4;
    _i_1 = (ushort *)((long)_i_1 + (long)iVar4);
  }
  _i_1 = (ushort *)(_lcu_h + (long)iVar3 + -2);
  tmpr = _lcu_h;
  for (lcu_w_c = 0; lcu_w_c < iVar13; lcu_w_c = lcu_w_c + 1) {
    *(ulong *)(tmpr + -8) = (ulong)*(ushort *)tmpr * 0x1000100010001;
    *(ulong *)(_i_1 + 1) = (ulong)*_i_1 * 0x1000100010001;
    tmpr = tmpr + iVar5;
    _i_1 = (ushort *)((long)_i_1 + (long)iVar5);
  }
  for (bit_depth = 0; bit_depth < iVar3; bit_depth = iVar1 + bit_depth) {
    local_118 = iVar1;
    if (iVar3 - bit_depth <= iVar1) {
      local_118 = iVar3 - bit_depth;
    }
    iVar14 = local_118 >> 1;
    pauVar16 = core->alf_enable_map + lcu_h_c;
    if ((*pauVar16)[0] == '\0') {
      map_patch._4_4_ = 3;
    }
    else {
      paiVar17 = (pcVar8->alf_param).filterCoeff_luma +
                 (pcVar8->alf_param).varIndTab[pcVar7->alf_idx_map[lcu_h_c]];
      tmp_s = bufc + -(long)map_patch._4_4_;
      _i_2 = dstc + -(long)map_patch._4_4_;
      for (tmp_d_1._0_4_ = 0; (int)tmp_d_1 < iVar10; tmp_d_1._0_4_ = (int)tmp_d_1 + 1) {
        memcpy(tmp_s,_i_2,(long)(local_118 + 3 + map_patch._4_4_));
        tmp_s = tmp_s + iVar11;
        _i_2 = _i_2 + iVar4;
      }
      (*uavs3d_funs_handle.alf[0])(dstc,iVar4,bufc,iVar11,local_118,iVar10,*paiVar17,iVar2);
      (*uavs3d_funs_handle.alf_fix[0])(dstc,iVar4,bufc,iVar11,local_118,iVar10,*paiVar17,iVar2);
      map_patch._4_4_ = -3;
    }
    if (((*pauVar16)[1] == '\0') && ((*pauVar16)[2] == '\0')) {
      map_patch._0_4_ = 6;
    }
    else {
      tmp_s_1 = _adj_c + -(long)(int)map_patch;
      _i_3 = _lcu_h + -(long)(int)map_patch;
      for (local_110 = 0; local_110 < iVar13; local_110 = local_110 + 1) {
        memcpy(tmp_s_1,_i_3,(long)(iVar14 * 2 + 6 + (int)map_patch));
        tmp_s_1 = tmp_s_1 + iVar12;
        _i_3 = _i_3 + iVar5;
      }
      map_patch._0_4_ = -6;
    }
    if (((*pauVar16)[1] == '\0') || ((*pauVar16)[2] == '\0')) {
      if ((*pauVar16)[1] != '\0') {
        (*uavs3d_funs_handle.alf[2])
                  (_lcu_h,iVar5,_adj_c,iVar12,iVar14,iVar13,(pcVar8->alf_param).filterCoeff_chroma,
                   iVar2);
        (*uavs3d_funs_handle.alf_fix[1])
                  (_lcu_h,iVar5,_adj_c,iVar12,iVar14,iVar13,(pcVar8->alf_param).filterCoeff_chroma,
                   iVar2);
      }
      if ((*pauVar16)[2] != '\0') {
        (*uavs3d_funs_handle.alf[2])
                  (_lcu_h + 1,iVar5,_adj_c + 1,iVar12,iVar14,iVar13,
                   (pcVar8->alf_param).filterCoeff_chroma + 1,iVar2);
        (*uavs3d_funs_handle.alf_fix[1])
                  (_lcu_h + 1,iVar5,_adj_c + 1,iVar12,iVar14,iVar13,
                   (pcVar8->alf_param).filterCoeff_chroma + 1,iVar2);
      }
    }
    else {
      (*uavs3d_funs_handle.alf[1])
                (_lcu_h,iVar5,_adj_c,iVar12,iVar14,iVar13,(pcVar8->alf_param).filterCoeff_chroma,
                 iVar2);
      (*uavs3d_funs_handle.alf_fix[1])
                (_lcu_h,iVar5,_adj_c,iVar12,iVar14,iVar13,(pcVar8->alf_param).filterCoeff_chroma,
                 iVar2);
      (*uavs3d_funs_handle.alf_fix[1])
                (_lcu_h + 1,iVar5,_adj_c + 1,iVar12,iVar14,iVar13,
                 (pcVar8->alf_param).filterCoeff_chroma + 1,iVar2);
    }
    lcu_h_c = lcu_h_c + 1;
    dstc = dstc + iVar1;
    _lcu_h = _lcu_h + iVar1;
    bufc = bufc + iVar1;
    _adj_c = _adj_c + iVar1;
  }
  return;
}

Assistant:

void com_alf_lcu_row(com_core_t *core, int lcu_y)
{
    com_pic_t* pic = core->pic;
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    com_alf_pic_param_t *alfParam = &core->pichdr->alf_param;
    int lcu_size = seqhdr->max_cuwh;
    int pix_x, pix_y = lcu_y * lcu_size;
    int bit_depth = seqhdr->bit_depth_internal;
    int img_width = seqhdr->pic_width;
    int img_height = seqhdr->pic_height;
    int i_dstl = pic->stride_luma;
    int i_dstc = pic->stride_chroma;
    pel *dstl  = pic->y;
    pel *dstc  = pic->uv;
    int lcu_idx = lcu_y * seqhdr->pic_width_in_lcu;
    int lcu_h = COM_MIN(lcu_size, img_height - pix_y);
    int lcu_h_c = lcu_h >> 1;
    int isAboveAvail = (lcu_y > 0);
    int isBelowAvail = (lcu_y < seqhdr->pic_height_in_lcu - 1);
    int y_offset = 0, height_offset = 0;
    int pix_y_c = pix_y >> 1;
    int i_bufl = lcu_size + ALIGN_BASIC;
    int i_bufc = (lcu_size / 2 + ALIGN_BASIC) * 2;
    pel *bufl = core->alf_src_buf[0] + ALIGN_BASIC;
    pel *bufc = core->alf_src_buf[1] + ALIGN_BASIC;
    int adj_l = 3, adj_c = 6;

    if (!seqhdr->cross_patch_loop_filter && isAboveAvail) {
        s8* map_patch = map->map_patch + lcu_y * seqhdr->pic_width_in_lcu;
        if (isAboveAvail && map_patch[0] != map_patch[-seqhdr->pic_width_in_lcu]) {
            isAboveAvail = FALSE;
        }
    }
    if (isAboveAvail) {
        y_offset -= 4;
        height_offset += 4;
    }
    if (isBelowAvail) {
        height_offset -= 4;
    }
    dstl += (pix_y + y_offset) * i_dstl;
    dstc += (pix_y_c + y_offset) * i_dstc;
    
    lcu_h   += height_offset;
    lcu_h_c += height_offset;

    // padding
    pel *tmpl = dstl, *tmpr = dstl + img_width - 1;
    for (int i = 0; i < lcu_h; i++) {
#if (BIT_DEPTH == 8)
        M32(tmpl - 4) = tmpl[0] * 0x01010101;
        M32(tmpr + 1) = tmpr[0] * 0x01010101;
#else
        M64(tmpl - 4) = tmpl[0] * 0x0001000100010001;
        M64(tmpr + 1) = tmpr[0] * 0x0001000100010001;
#endif
        tmpl += i_dstl;
        tmpr += i_dstl;
    }

    tmpl = dstc, tmpr = dstc + img_width - 2;
    for (int i = 0; i < lcu_h_c; i++) {
#if (BIT_DEPTH == 8)
        M64(tmpl - 8) = M16(tmpl) * 0x0001000100010001;
        M64(tmpr + 2) = M16(tmpr) * 0x0001000100010001;
#else
        M64(tmpl - 8) = M64(tmpl - 4) = M32(tmpl) * 0x0000000100000001;
        M64(tmpr + 2) = M64(tmpr + 6) = M32(tmpr) * 0x0000000100000001;
#endif
        tmpl += i_dstc;
        tmpr += i_dstc;
    }

    for (pix_x = 0; pix_x < img_width; pix_x += lcu_size, lcu_idx++, dstl += lcu_size, dstc += lcu_size, bufl += lcu_size, bufc += lcu_size) {
        int lcu_w = COM_MIN(lcu_size, img_width  - pix_x);
        int lcu_w_c = lcu_w >> 1;
        u8 *enable_flag = core->alf_enable_map[lcu_idx];

        if (enable_flag[Y_C]) {
            int *coef = alfParam->filterCoeff_luma[alfParam->varIndTab[seqhdr->alf_idx_map[lcu_idx]]];
            pel *tmp_d = bufl - adj_l;
            pel *tmp_s = dstl - adj_l;
            int cpy_size = (lcu_w + 3 + adj_l) * sizeof(pel);
 
            for (int i = 0; i < lcu_h; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufl;
                tmp_s += i_dstl;
            }
            uavs3d_funs_handle.alf    [Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            uavs3d_funs_handle.alf_fix[Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            adj_l = -3;
        } else {
            adj_l = 3;
        }
        if (enable_flag[U_C] || enable_flag[V_C]) {
            pel *tmp_d = bufc - adj_c;
            pel *tmp_s = dstc - adj_c;
            int cpy_size = (lcu_w_c * 2 + 6 + adj_c) * sizeof(pel);

            for (int i = 0; i < lcu_h_c; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufc;
                tmp_s += i_dstc;
            }
            adj_c = -6;
        } else {
            adj_c = 6;
        }
        if (enable_flag[U_C] && enable_flag[V_C]) {
            uavs3d_funs_handle.alf    [UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
        } else {
            if (enable_flag[U_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
            }
            if (enable_flag[V_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
            }
        }
    }
}